

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O2

_Bool uit_progress(mdl_t *mdl,uint32_t it,double obj)

{
  double dVar1;
  uint uVar2;
  opt_t *poVar3;
  double *pdVar4;
  uint32_t i;
  uint uVar5;
  ulong uVar6;
  uint64_t f;
  uint64_t uVar7;
  bool bVar8;
  char *msg;
  long lVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double te;
  double se;
  tms_t now;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  timeval local_30;
  
  local_40 = obj;
  tag_eval(mdl,&local_50,&local_38);
  lVar9 = 0;
  for (uVar7 = 0; mdl->nftr != uVar7; uVar7 = uVar7 + 1) {
    lVar9 = lVar9 + (ulong)(mdl->theta[uVar7] != 0.0);
  }
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  local_48 = ((double)CONCAT44(local_30.tv_usec._4_4_,(undefined4)local_30.tv_usec) * 1e-06 +
             (double)CONCAT44(local_30.tv_sec._4_4_,(undefined4)local_30.tv_sec)) -
             ((double)(mdl->timer).tv_usec * 1e-06 + (double)(mdl->timer).tv_sec);
  mdl->total = mdl->total + local_48;
  *(undefined4 *)&(mdl->timer).tv_sec = (undefined4)local_30.tv_sec;
  *(undefined4 *)((long)&(mdl->timer).tv_sec + 4) = local_30.tv_sec._4_4_;
  *(undefined4 *)&(mdl->timer).tv_usec = (undefined4)local_30.tv_usec;
  *(undefined4 *)((long)&(mdl->timer).tv_usec + 4) = local_30.tv_usec._4_4_;
  info("  [%4u]",it);
  msg = " obj=NA";
  if (0.0 <= local_40) {
    msg = " obj=%-10.2f";
  }
  bVar8 = true;
  info(msg);
  info(" act=%-8lu",lVar9);
  info(" err=%5.2f%%/%5.2f%%",SUB84(local_50,0),local_38);
  info(" time=%.2fs/%.2fs",SUB84(local_48,0),mdl->total);
  info("\n");
  poVar3 = mdl->opt;
  uVar2 = poVar3->stopwin;
  if ((ulong)uVar2 != 0) {
    pdVar4 = mdl->werr;
    uVar5 = mdl->wpos;
    pdVar4[uVar5] = local_50;
    mdl->wpos = (uVar5 + 1) % uVar2;
    uVar5 = mdl->wcnt + 1;
    mdl->wcnt = uVar5;
    if (uVar2 <= uVar5) {
      dVar12 = -100.0;
      uVar10 = 0;
      uVar11 = 0x40690000;
      for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
        dVar1 = pdVar4[uVar6];
        if (dVar1 <= (double)CONCAT44(uVar11,uVar10)) {
          uVar10 = SUB84(dVar1,0);
          uVar11 = (undefined4)((ulong)dVar1 >> 0x20);
        }
        if (dVar1 <= dVar12) {
          dVar1 = dVar12;
        }
        dVar12 = dVar1;
      }
      bVar8 = poVar3->stopeps <= dVar12 - (double)CONCAT44(uVar11,uVar10);
    }
  }
  return (_Bool)((uit_stop ^ 1U) & bVar8);
}

Assistant:

bool uit_progress(mdl_t *mdl, uint32_t it, double obj) {
	// First we just compute the error rate on devel or train data
	double te, se;
	tag_eval(mdl, &te, &se);
	// Next, we compute the number of active features
	uint64_t act = 0;
	for (uint64_t f = 0; f < mdl->nftr; f++)
		if (mdl->theta[f] != 0.0)
			act++;
	// Compute timings. As some training algorithms are multi-threaded, we
	// cannot use ansi/c function and must rely on posix one to sum time
	// spent in main thread and in child ones.
	tms_t now; gettimeofday(&now, NULL);
	double tm = (now.tv_sec        + (double)now.tv_usec        * 1.0e-6)
	          - (mdl->timer.tv_sec + (double)mdl->timer.tv_usec * 1.0e-6);
	mdl->total += tm;
	mdl->timer  = now;
	// And display progress report
	info("  [%4"PRIu32"]", it);
	info(obj >= 0.0 ? " obj=%-10.2f" : " obj=NA", obj);
	info(" act=%-8"PRIu64, act);
	info(" err=%5.2f%%/%5.2f%%", te, se);
	info(" time=%.2fs/%.2fs", tm, mdl->total);
	info("\n");
	// If requested, check the error rate stoping criterion. We check if the
	// error rate is stable enought over a few iterations.
	bool res = true;
	if (mdl->opt->stopwin != 0) {
		mdl->werr[mdl->wpos] = te;
		mdl->wpos = (mdl->wpos + 1) % mdl->opt->stopwin;
		mdl->wcnt++;
		if (mdl->wcnt >= mdl->opt->stopwin) {
			double emin = 200.0, emax = -100.0;
			for (uint32_t i = 0; i < mdl->opt->stopwin; i++) {
				emin = min(emin, mdl->werr[i]);
				emax = max(emax, mdl->werr[i]);
			}
			if (emax - emin < mdl->opt->stopeps)
				res = false;
		}
	}
	// And return
	if (uit_stop)
		return false;
	return res;
}